

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_image_dither(rf_image *__return_storage_ptr__,rf_image image,int r_bpp,int g_bpp,int b_bpp,
               int a_bpp,rf_allocator allocator,rf_allocator temp_allocator)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  rf_source_location rVar5;
  rf_allocator_args rVar6;
  rf_allocator allocator_00;
  rf_image image_00;
  byte bVar7;
  rf_allocator_proc *prVar8;
  rf_color *prVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  uchar uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long in_FS_OFFSET;
  long local_110;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  
  prVar8 = temp_allocator.allocator_proc;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if ((image.valid == true) && (image.format == RF_UNCOMPRESSED_R8G8B8)) {
    if (g_bpp + r_bpp + a_bpp + b_bpp < 0x10) {
      image_00.width = in_stack_ffffffffffffff98;
      image_00.data = (void *)in_stack_ffffffffffffff90;
      image_00.height = in_stack_ffffffffffffff9c;
      image_00._16_8_ = in_stack_ffffffffffffffa0;
      allocator_00.user_data._4_4_ = in_stack_ffffffffffffff1c;
      allocator_00.user_data._0_4_ = in_stack_ffffffffffffff18;
      allocator_00.allocator_proc._0_4_ = in_stack_ffffffffffffff20;
      allocator_00.allocator_proc._4_4_ = in_stack_ffffffffffffff24;
      prVar9 = rf_image_pixels_to_rgba32(image_00,allocator_00);
      if (0 < (long)image.height) {
        lVar17 = (long)image.width;
        bVar11 = 8 - (char)r_bpp;
        bVar12 = 8 - (char)g_bpp;
        bVar13 = 8 - (char)b_bpp;
        bVar7 = (byte)(a_bpp + b_bpp);
        local_110 = 0;
        do {
          if (0 < image.width) {
            lVar10 = (local_110 + 1) * lVar17;
            lVar21 = lVar17 * 4 * local_110;
            lVar22 = 0;
            do {
              bVar1 = (&prVar9[lVar22].r)[lVar21] >> (bVar11 & 0x1f);
              bVar2 = (&prVar9[lVar22].g)[lVar21] >> (bVar12 & 0x1f);
              bVar3 = (&prVar9[lVar22].b)[lVar21] >> (bVar13 & 0x1f);
              bVar4 = (&prVar9[lVar22].a)[lVar21] >> (8 - (byte)a_bpp & 0x1f);
              iVar18 = (uint)(&prVar9[lVar22].r)[lVar21] - ((uint)bVar1 << (bVar11 & 0x1f));
              iVar19 = (uint)(&prVar9[lVar22].g)[lVar21] - ((uint)bVar2 << (bVar12 & 0x1f));
              iVar16 = (uint)(&prVar9[lVar22].b)[lVar21] - ((uint)bVar3 << (bVar13 & 0x1f));
              (&prVar9[lVar22].r)[lVar21] = bVar1;
              (&prVar9[lVar22].g)[lVar21] = bVar2;
              (&prVar9[lVar22].b)[lVar21] = bVar3;
              (&prVar9[lVar22].a)[lVar21] = bVar4;
              if (lVar22 < lVar17 + -1) {
                iVar15 = (int)((float)iVar18 * 7.0 * 0.0625) + (uint)(&prVar9[lVar22 + 1].r)[lVar21]
                ;
                uVar14 = (uchar)iVar15;
                if (0xfe < iVar15) {
                  uVar14 = 0xff;
                }
                (&prVar9[lVar22 + 1].r)[lVar21] = uVar14;
                iVar15 = (int)((float)iVar19 * 7.0 * 0.0625) + (uint)(&prVar9[lVar22 + 1].g)[lVar21]
                ;
                uVar14 = (uchar)iVar15;
                if (0xfe < iVar15) {
                  uVar14 = 0xff;
                }
                (&prVar9[lVar22 + 1].g)[lVar21] = uVar14;
                iVar15 = (int)((float)iVar16 * 7.0 * 0.0625) + (uint)(&prVar9[lVar22 + 1].b)[lVar21]
                ;
                uVar14 = (uchar)iVar15;
                if (0xfe < iVar15) {
                  uVar14 = 0xff;
                }
                (&prVar9[lVar22 + 1].b)[lVar21] = uVar14;
              }
              if ((lVar22 != 0) && (local_110 < (long)(ulong)(image.height - 1))) {
                iVar15 = (int)((float)iVar18 * 3.0 * 0.0625) + (uint)prVar9[lVar10 + lVar22 + -1].r;
                uVar14 = (uchar)iVar15;
                if (0xfe < iVar15) {
                  uVar14 = 0xff;
                }
                prVar9[lVar10 + lVar22 + -1].r = uVar14;
                iVar15 = (int)((float)iVar19 * 3.0 * 0.0625) + (uint)prVar9[lVar10 + lVar22 + -1].g;
                uVar14 = (uchar)iVar15;
                if (0xfe < iVar15) {
                  uVar14 = 0xff;
                }
                prVar9[lVar10 + lVar22 + -1].g = uVar14;
                iVar15 = (int)((float)iVar16 * 3.0 * 0.0625) + (uint)prVar9[lVar10 + lVar22 + -1].b;
                uVar14 = (uchar)iVar15;
                if (0xfe < iVar15) {
                  uVar14 = 0xff;
                }
                prVar9[lVar10 + lVar22 + -1].b = uVar14;
              }
              if (local_110 < (long)(ulong)(image.height - 1)) {
                iVar15 = (int)((float)iVar18 * 5.0 * 0.0625) + (uint)prVar9[lVar10 + lVar22].r;
                uVar14 = (uchar)iVar15;
                if (0xfe < iVar15) {
                  uVar14 = 0xff;
                }
                iVar15 = (int)((float)iVar19 * 5.0 * 0.0625) + (uint)prVar9[lVar10 + lVar22].g;
                if (0xfe < iVar15) {
                  iVar15 = 0xff;
                }
                iVar20 = (int)((float)iVar16 * 5.0 * 0.0625) + (uint)prVar9[lVar10 + lVar22].b;
                if (0xfe < iVar20) {
                  iVar20 = 0xff;
                }
                prVar9[lVar10 + lVar22].r = uVar14;
                prVar9[lVar10 + lVar22].g = (uchar)iVar15;
                prVar9[lVar10 + lVar22].b = (uchar)iVar20;
                if (lVar22 < lVar17 + -1) {
                  iVar18 = (int)((float)iVar18 * 0.0625) + (uint)prVar9[lVar10 + lVar22 + 1].r;
                  uVar14 = (uchar)iVar18;
                  if (0xfe < iVar18) {
                    uVar14 = 0xff;
                  }
                  prVar9[lVar10 + lVar22 + 1].r = uVar14;
                  iVar18 = (int)((float)iVar19 * 0.0625) + (uint)prVar9[lVar10 + lVar22 + 1].g;
                  uVar14 = (uchar)iVar18;
                  if (0xfe < iVar18) {
                    uVar14 = 0xff;
                  }
                  prVar9[lVar10 + lVar22 + 1].g = uVar14;
                  iVar16 = (int)((float)iVar16 * 0.0625) + (uint)prVar9[lVar10 + lVar22 + 1].b;
                  uVar14 = (uchar)iVar16;
                  if (0xfe < iVar16) {
                    uVar14 = 0xff;
                  }
                  prVar9[lVar10 + lVar22 + 1].b = uVar14;
                }
              }
              *(ushort *)((long)image.data + lVar22 * 2 + local_110 * lVar17 * 2) =
                   (ushort)bVar3 << ((byte)a_bpp & 0x1f) | (ushort)bVar4 |
                   (ushort)bVar2 << (bVar7 & 0x1f) | (ushort)bVar1 << ((char)g_bpp + bVar7 & 0x1f);
              lVar22 = lVar22 + 1;
            } while (lVar17 != lVar22);
          }
          local_110 = local_110 + 1;
        } while (local_110 != image.height);
      }
      rVar5.proc_name._0_4_ = 0x17b3de;
      rVar5.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar5.proc_name._4_4_ = 0;
      rVar5.line_in_file = 0x3fb3;
      rVar6.size_to_allocate_or_reallocate = 0;
      rVar6.pointer_to_free_or_realloc = prVar9;
      rVar6._16_8_ = (ulong)in_stack_ffffffffffffff9c << 0x20;
      (*prVar8)(&temp_allocator,rVar5,RF_AM_FREE,rVar6);
    }
    else {
      rf_log_impl(8,0x17b3ee,(char *)0x1);
      *(char **)(in_FS_OFFSET + -0x450) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(in_FS_OFFSET + -0x448) = "rf_image_dither";
      *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3fb5;
      *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_dither(const rf_image image, int r_bpp, int g_bpp, int b_bpp, int a_bpp, rf_allocator allocator, rf_allocator temp_allocator)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (image.format == RF_UNCOMPRESSED_R8G8B8)
        {
            if (image.format == RF_UNCOMPRESSED_R8G8B8 && (r_bpp + g_bpp + b_bpp + a_bpp) < 16)
            {
                rf_color* pixels = rf_image_pixels_to_rgba32(image, temp_allocator);

                if ((image.format != RF_UNCOMPRESSED_R8G8B8) && (image.format != RF_UNCOMPRESSED_R8G8B8A8))
                {
                    RF_LOG(RF_LOG_TYPE_WARNING, "rf_image format is already 16bpp or lower, dithering could have no effect");
                }

                // Todo: Finish implementing this function
//                // Define new image format, check if desired bpp match internal known format
//                if ((r_bpp == 5) && (g_bpp == 6) && (b_bpp == 5) && (a_bpp == 0)) image.format = RF_UNCOMPRESSED_R5G6B5;
//                else if ((r_bpp == 5) && (g_bpp == 5) && (b_bpp == 5) && (a_bpp == 1)) image.format = RF_UNCOMPRESSED_R5G5B5A1;
//                else if ((r_bpp == 4) && (g_bpp == 4) && (b_bpp == 4) && (a_bpp == 4)) image.format = RF_UNCOMPRESSED_R4G4B4A4;
//                else
//                {
//                    image.format = 0;
//                    RF_LOG(RF_LOG_TYPE_WARNING, "Unsupported dithered OpenGL internal format: %ibpp (R%i_g%i_b%i_a%i)", (r_bpp + g_bpp + b_bpp + a_bpp), r_bpp, g_bpp, b_bpp, a_bpp);
//                }
//
//                // NOTE: We will store the dithered data as unsigned short (16bpp)
//                image.data = (unsigned short*) RF_ALLOC(image.allocator, image.width * image.height * sizeof(unsigned short));

                rf_color old_pixel = RF_WHITE;
                rf_color new_pixel  = RF_WHITE;

                int r_error, g_error, b_error;
                unsigned short r_pixel, g_pixel, b_pixel, a_pixel; // Used for 16bit pixel composition

                for (rf_int y = 0; y < image.height; y++)
                {
                    for (rf_int x = 0; x < image.width; x++)
                    {
                        old_pixel = pixels[y * image.width + x];

                        // NOTE: New pixel obtained by bits truncate, it would be better to round values (check rf_image_format())
                        new_pixel.r = old_pixel.r >> (8 - r_bpp); // R bits
                        new_pixel.g = old_pixel.g >> (8 - g_bpp); // G bits
                        new_pixel.b = old_pixel.b >> (8 - b_bpp); // B bits
                        new_pixel.a = old_pixel.a >> (8 - a_bpp); // A bits (not used on dithering)

                        // NOTE: Error must be computed between new and old pixel but using same number of bits!
                        // We want to know how much color precision we have lost...
                        r_error = (int)old_pixel.r - (int)(new_pixel.r << (8 - r_bpp));
                        g_error = (int)old_pixel.g - (int)(new_pixel.g << (8 - g_bpp));
                        b_error = (int)old_pixel.b - (int)(new_pixel.b << (8 - b_bpp));

                        pixels[y*image.width + x] = new_pixel;

                        // NOTE: Some cases are out of the array and should be ignored
                        if (x < (image.width - 1))
                        {
                            pixels[y*image.width + x+1].r = rf_min_i((int)pixels[y * image.width + x + 1].r + (int)((float)r_error * 7.0f / 16), 0xff);
                            pixels[y*image.width + x+1].g = rf_min_i((int)pixels[y * image.width + x + 1].g + (int)((float)g_error * 7.0f / 16), 0xff);
                            pixels[y*image.width + x+1].b = rf_min_i((int)pixels[y * image.width + x + 1].b + (int)((float)b_error * 7.0f / 16), 0xff);
                        }

                        if ((x > 0) && (y < (image.height - 1)))
                        {
                            pixels[(y+1)*image.width + x-1].r = rf_min_i((int)pixels[(y + 1) * image.width + x - 1].r + (int)((float)r_error * 3.0f / 16), 0xff);
                            pixels[(y+1)*image.width + x-1].g = rf_min_i((int)pixels[(y + 1) * image.width + x - 1].g + (int)((float)g_error * 3.0f / 16), 0xff);
                            pixels[(y+1)*image.width + x-1].b = rf_min_i((int)pixels[(y + 1) * image.width + x - 1].b + (int)((float)b_error * 3.0f / 16), 0xff);
                        }

                        if (y < (image.height - 1))
                        {
                            pixels[(y+1)*image.width + x].r = rf_min_i((int)pixels[(y+1)*image.width + x].r + (int)((float)r_error*5.0f/16), 0xff);
                            pixels[(y+1)*image.width + x].g = rf_min_i((int)pixels[(y+1)*image.width + x].g + (int)((float)g_error*5.0f/16), 0xff);
                            pixels[(y+1)*image.width + x].b = rf_min_i((int)pixels[(y+1)*image.width + x].b + (int)((float)b_error*5.0f/16), 0xff);
                        }

                        if ((x < (image.width - 1)) && (y < (image.height - 1)))
                        {
                            pixels[(y+1)*image.width + x+1].r = rf_min_i((int)pixels[(y+1)*image.width + x+1].r + (int)((float)r_error*1.0f/16), 0xff);
                            pixels[(y+1)*image.width + x+1].g = rf_min_i((int)pixels[(y+1)*image.width + x+1].g + (int)((float)g_error*1.0f/16), 0xff);
                            pixels[(y+1)*image.width + x+1].b = rf_min_i((int)pixels[(y+1)*image.width + x+1].b + (int)((float)b_error*1.0f/16), 0xff);
                        }

                        r_pixel = (unsigned short)new_pixel.r;
                        g_pixel = (unsigned short)new_pixel.g;
                        b_pixel = (unsigned short)new_pixel.b;
                        a_pixel = (unsigned short)new_pixel.a;

                        ((unsigned short *)image.data)[y*image.width + x] = (r_pixel << (g_bpp + b_bpp + a_bpp)) | (g_pixel << (b_bpp + a_bpp)) | (b_pixel << a_bpp) | a_pixel;
                    }
                }

                RF_FREE(temp_allocator, pixels);
            }
            else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Unsupported dithering bpps (%ibpp), only 16bpp or lower modes supported", (r_bpp + g_bpp + b_bpp + a_bpp));
        }
    }

    return result;
}